

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
::linear_search_impl<std::pair<int,int>,std::less<std::pair<int,int>>>
          (btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
           *this,pair<int,_int> *k,int s,int e,less<std::pair<int,_int>_> *comp)

{
  bool bVar1;
  key_type *__x;
  less<std::pair<int,_int>_> *comp_local;
  int e_local;
  int s_local;
  pair<int,_int> *k_local;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return (SearchResult<int,_false>)comp_local._4_4_;
    }
    __x = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::key((btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                 *)this,(long)comp_local._4_4_);
    bVar1 = std::less<std::pair<int,_int>_>::operator()(comp,__x,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }